

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spoa::Graph::InitializeMultipleSequenceAlignment
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Graph *this,
          uint32_t *row_size)

{
  pointer ppNVar1;
  pointer puVar2;
  Node *pNVar3;
  pointer ppNVar4;
  long lVar5;
  uint32_t uVar6;
  ulong uVar7;
  pointer ppNVar8;
  allocator_type local_19;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_19);
  ppNVar1 = (this->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar5 = (long)(this->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1;
  if (lVar5 == 0) {
    uVar6 = 0;
  }
  else {
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar6 = 0;
    do {
      pNVar3 = ppNVar1[uVar7];
      puVar2[pNVar3->id] = uVar6;
      ppNVar4 = *(pointer *)
                 ((long)&(pNVar3->aligned_nodes).
                         super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                         ._M_impl + 8);
      for (ppNVar8 = (pNVar3->aligned_nodes).
                     super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppNVar8 != ppNVar4;
          ppNVar8 = ppNVar8 + 1) {
        uVar7 = (ulong)((int)uVar7 + 1);
        puVar2[(*ppNVar8)->id] = uVar6;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)(lVar5 >> 3));
  }
  if (row_size != (uint32_t *)0x0) {
    *row_size = uVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint32_t> Graph::InitializeMultipleSequenceAlignment(
    std::uint32_t* row_size) const {
  std::vector<std::uint32_t> dst(nodes_.size());
  std::uint32_t j = 0;
  for (std::uint32_t i = 0; i < rank_to_node_.size(); ++i, ++j) {
    auto it = rank_to_node_[i];
    dst[it->id] = j;
    for (const auto& jt : it->aligned_nodes) {
      dst[jt->id] = j;
      ++i;
    }
  }
  if (row_size) {
    *row_size = j;
  }
  return dst;
}